

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O0

void __thiscall vera::HaveDefines::HaveDefines(HaveDefines *this)

{
  HaveDefines *this_local;
  
  this->_vptr_HaveDefines = (_func_int **)&PTR__HaveDefines_0076c220;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_defines);
  this->m_defineChange = false;
  return;
}

Assistant:

HaveDefines::HaveDefines() : m_defineChange(false) {
}